

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O2

void push_layout(mu_Context *ctx,mu_Rect body,mu_Vec2 scroll)

{
  mu_Layout *pmVar1;
  mu_Rect *pmVar2;
  mu_Vec2 *pmVar3;
  int *piVar4;
  uint in_EAX;
  long lVar5;
  ulong uVar6;
  undefined8 in_R9;
  ulong uStack_8;
  int width;
  
  uStack_8 = (ulong)in_EAX;
  lVar5 = (long)(ctx->layout_stack).idx;
  if (lVar5 < 0x10) {
    uVar6 = (ulong)(uint)(body.x - scroll.x) |
            body._0_8_ - ((ulong)scroll & 0xffffffff00000000) & 0xffffffff00000000;
    pmVar1 = (ctx->layout_stack).items + lVar5;
    (pmVar1->body).x = (int)uVar6;
    (pmVar1->body).y = (int)(uVar6 >> 0x20);
    pmVar1 = (ctx->layout_stack).items + lVar5;
    (pmVar1->body).w = (int)body._8_8_;
    (pmVar1->body).h = (int)((ulong)body._8_8_ >> 0x20);
    pmVar2 = &(ctx->layout_stack).items[lVar5].next;
    pmVar2->x = 0;
    pmVar2->y = 0;
    pmVar2->w = 0;
    pmVar2->h = 0;
    pmVar3 = &(ctx->layout_stack).items[lVar5].position;
    pmVar3->x = 0;
    pmVar3->y = 0;
    pmVar3[1].x = 0;
    pmVar3[1].y = 0;
    pmVar1 = (ctx->layout_stack).items + lVar5;
    (pmVar1->max).x = -0x1000000;
    (pmVar1->max).y = -0x1000000;
    piVar4 = (ctx->layout_stack).items[lVar5].widths;
    piVar4[0] = 0;
    piVar4[1] = 0;
    piVar4[2] = 0;
    piVar4[3] = 0;
    piVar4 = (ctx->layout_stack).items[lVar5].widths;
    piVar4[4] = 0;
    piVar4[5] = 0;
    piVar4[6] = 0;
    piVar4[7] = 0;
    piVar4 = (ctx->layout_stack).items[lVar5].widths;
    piVar4[8] = 0;
    piVar4[9] = 0;
    piVar4[10] = 0;
    piVar4[0xb] = 0;
    piVar4 = (ctx->layout_stack).items[lVar5].widths;
    piVar4[0xc] = 0;
    piVar4[0xd] = 0;
    piVar4[0xe] = 0;
    piVar4[0xf] = 0;
    (ctx->layout_stack).items[lVar5].indent = 0;
    pmVar1 = (ctx->layout_stack).items + lVar5;
    pmVar1->items = 0;
    pmVar1->item_index = 0;
    *(undefined8 *)(&pmVar1->items + 2) = 0;
    (ctx->layout_stack).idx = (ctx->layout_stack).idx + 1;
    mu_layout_row(ctx,1,&width,0);
    return;
  }
  fprintf(_stderr,"Fatal error: %s:%d: assertion \'%s\' failed\n",
          "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/microui/microui.c"
          ,0x11a,
          "(ctx->layout_stack).idx < (int) (sizeof((ctx->layout_stack).items) / sizeof(*(ctx->layout_stack).items))"
          ,in_R9,uStack_8);
  abort();
}

Assistant:

static void push_layout(mu_Context *ctx, mu_Rect body, mu_Vec2 scroll) {
  mu_Layout layout;
  int width = 0;
  memset(&layout, 0, sizeof(layout));
  layout.body = mu_rect(body.x - scroll.x, body.y - scroll.y, body.w, body.h);
  layout.max = mu_vec2(-0x1000000, -0x1000000);
  push(ctx->layout_stack, layout);
  mu_layout_row(ctx, 1, &width, 0);
}